

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_index_meta(jit_State *J,CTState *cts,CType *ct,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  cTValue *pcVar3;
  cTValue *o;
  cTValue *tv;
  CTypeID id;
  RecordFFData *rd_local;
  CType *ct_local;
  CTState *cts_local;
  jit_State *J_local;
  
  pcVar3 = lj_ctype_meta(cts,(CTypeID)(((long)ct - (long)cts->tab) / 0x18),(uint)(rd->data != 0));
  if (pcVar3 == (cTValue *)0x0) {
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  if ((int)(pcVar3->field_4).it >> 0xf == -9) {
    crec_tailcall(J,rd,pcVar3);
  }
  else {
    if (((rd->data != 0) || ((int)(pcVar3->field_4).it >> 0xf != -0xc)) ||
       ((J->base[1] & 0x1f000000) != 0x4000000)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    pcVar3 = lj_tab_get(J->L,(GCtab *)(pcVar3->u64 & 0x7fffffffffff),rd->argv + 1);
    TVar1 = lj_record_constify(J,pcVar3);
    *J->base = TVar1;
    if (*J->base == 0) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar1 = J->base[1];
    TVar2 = lj_ir_kgc(J,(GCobj *)(rd->argv[1].u64 & 0x7fffffffffff),IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
  }
  return;
}

Assistant:

static void crec_index_meta(jit_State *J, CTState *cts, CType *ct,
			    RecordFFData *rd)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, rd->data ? MM_newindex : MM_index);
  if (!tv)
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  if (tvisfunc(tv)) {
    crec_tailcall(J, rd, tv);
  } else if (rd->data == 0 && tvistab(tv) && tref_isstr(J->base[1])) {
    /* Specialize to result of __index lookup. */
    cTValue *o = lj_tab_get(J->L, tabV(tv), &rd->argv[1]);
    J->base[0] = lj_record_constify(J, o);
    if (!J->base[0])
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    /* Always specialize to the key. */
    emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, strV(&rd->argv[1])));
  } else {
    /* NYI: resolving of non-function metamethods. */
    /* NYI: non-string keys for __index table. */
    /* NYI: stores to __newindex table. */
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
}